

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias.cpp
# Opt level: O2

int __thiscall ncnn::Bias::load_model(Bias *this,ModelBin *mb)

{
  int *piVar1;
  Allocator *pAVar2;
  int iVar3;
  void *local_60;
  int *local_58;
  size_t local_50;
  int local_48;
  Allocator *local_40;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  size_t local_20;
  
  (*mb->_vptr_ModelBin[2])(&local_60,mb,(ulong)(uint)this->bias_data_size,1);
  if (&this->bias_data != (Mat *)&local_60) {
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    piVar1 = (this->bias_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pAVar2 = (this->bias_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->bias_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->bias_data).data = local_60;
    (this->bias_data).refcount = local_58;
    (this->bias_data).elemsize = local_50;
    (this->bias_data).elempack = local_48;
    (this->bias_data).allocator = local_40;
    (this->bias_data).dims = local_38;
    (this->bias_data).w = iStack_34;
    (this->bias_data).h = iStack_30;
    (this->bias_data).d = iStack_2c;
    (this->bias_data).c = local_28;
    (this->bias_data).cstep = local_20;
  }
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (*local_58 == 0) {
      if (local_40 == (Allocator *)0x0) {
        free(local_60);
      }
      else {
        (*local_40->_vptr_Allocator[3])();
      }
    }
  }
  if (((this->bias_data).data == (void *)0x0) ||
     (iVar3 = 0, (long)(this->bias_data).c * (this->bias_data).cstep == 0)) {
    iVar3 = -100;
  }
  return iVar3;
}

Assistant:

int Bias::load_model(const ModelBin& mb)
{
    bias_data = mb.load(bias_data_size, 1);
    if (bias_data.empty())
        return -100;

    return 0;
}